

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

QRect __thiscall QStatusBarPrivate::messageRect(QStatusBarPrivate *this)

{
  QRect QVar1;
  bool bVar2;
  LayoutDirection LVar3;
  int iVar4;
  int iVar5;
  SBItem *this_00;
  int *piVar6;
  QStatusBarPrivate *in_RDI;
  long in_FS_OFFSET;
  SBItem *item;
  QList<QStatusBarPrivate::SBItem> *__range1;
  bool rtl;
  QStatusBar *q;
  const_iterator __end1;
  const_iterator __begin1;
  int right;
  int left;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QRect *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  int local_40;
  int local_3c;
  SBItem *local_38;
  const_iterator local_30;
  const_iterator local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  LVar3 = QWidget::layoutDirection((QWidget *)0x6a2c3f);
  local_1c = 6;
  local_20 = QWidget::width((QWidget *)0x6a2c5d);
  local_20 = local_20 + -0xc;
  if ((in_RDI->resizer != (QSizeGrip *)0x0) &&
     (bVar2 = QWidget::isVisible((QWidget *)0x6a2c86), bVar2)) {
    if (LVar3 != RightToLeft) {
      local_20 = QWidget::x(in_stack_ffffffffffffff80);
    }
    else {
      iVar4 = QWidget::x(in_stack_ffffffffffffff80);
      local_1c = QWidget::width((QWidget *)0x6a2cbb);
      local_1c = iVar4 + local_1c;
    }
  }
  local_28.i = (SBItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QStatusBarPrivate::SBItem>::begin
                       ((QList<QStatusBarPrivate::SBItem> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_30.i = (SBItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QStatusBarPrivate::SBItem>::end
                       ((QList<QStatusBarPrivate::SBItem> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  do {
    local_38 = local_30.i;
    bVar2 = QList<QStatusBarPrivate::SBItem>::const_iterator::operator!=(&local_28,local_30);
    if (!bVar2) {
LAB_006a2e22:
      iVar5 = local_20 - local_1c;
      iVar4 = local_1c;
      QWidget::height((QWidget *)0x6a2e3e);
      QRect::QRect(in_stack_ffffffffffffff78,iVar5,iVar4,in_stack_ffffffffffffff6c,
                   in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      QVar1.x2.m_i = (undefined4)local_10;
      QVar1.y2.m_i = local_10._4_4_;
      QVar1.x1.m_i = (undefined4)local_18;
      QVar1.y1.m_i = local_18._4_4_;
      return QVar1;
    }
    this_00 = QList<QStatusBarPrivate::SBItem>::const_iterator::operator*(&local_28);
    bVar2 = SBItem::isPermanent(this_00);
    if ((bVar2) && (bVar2 = QWidget::isVisible((QWidget *)0x6a2d95), bVar2)) {
      if (LVar3 != RightToLeft) {
        local_40 = QWidget::x(in_stack_ffffffffffffff80);
        local_40 = local_40 + -2;
        piVar6 = qMin<int>(&local_20,&local_40);
        local_20 = *piVar6;
      }
      else {
        iVar4 = QWidget::x(in_stack_ffffffffffffff80);
        iVar5 = QWidget::width((QWidget *)0x6a2dc0);
        local_3c = iVar4 + iVar5 + 2;
        piVar6 = qMax<int>(&local_1c,&local_3c);
        local_1c = *piVar6;
      }
      goto LAB_006a2e22;
    }
    QList<QStatusBarPrivate::SBItem>::const_iterator::operator++(&local_28);
  } while( true );
}

Assistant:

QRect QStatusBarPrivate::messageRect() const
{
    Q_Q(const QStatusBar);
    const bool rtl = q->layoutDirection() == Qt::RightToLeft;

    int left = 6;
    int right = q->width() - 12;

#if QT_CONFIG(sizegrip)
    if (resizer && resizer->isVisible()) {
        if (rtl)
            left = resizer->x() + resizer->width();
        else
            right = resizer->x();
    }
#endif

    for (const auto &item : items) {
        if (item.isPermanent() && item.widget->isVisible()) {
            if (rtl)
                left = qMax(left, item.widget->x() + item.widget->width() + 2);
            else
                right = qMin(right, item.widget->x() - 2);
            break;
        }
    }
    return QRect(left, 0, right-left, q->height());
}